

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2wat.cc
# Opt level: O0

int ProgramMain(int argc,char **argv)

{
  FILE *file;
  bool bVar1;
  Enum EVar2;
  char *pcVar3;
  pointer log_stream;
  uchar *data;
  size_type size;
  ulong uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  string_view filename;
  string local_520;
  Enum local_4fc;
  string_view local_4f8;
  undefined1 local_4e8 [8];
  FileStream stream;
  WriteWatOptions wat_options;
  Result dummy_result;
  undefined1 local_47f [8];
  ValidateOptions options_1;
  undefined1 local_460 [8];
  ReadBinaryOptions options;
  undefined1 local_430 [7];
  bool kStopOnFirstError;
  Module module;
  Errors errors;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  Enum local_3c;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  Result result;
  char **argv_local;
  int argc_local;
  
  wabt::Result::Result
            ((Result *)
             ((long)&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  wabt::InitStdio();
  ParseOptions(argc,argv);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,pcVar3);
  filename._M_str = local_38;
  filename._M_len = (size_t)local_50._M_str;
  local_3c = (Enum)wabt::ReadFile((wabt *)local_50._M_len,filename,in_RCX);
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (Result)local_3c;
  bVar1 = wabt::Succeeded((Result)local_3c);
  if (bVar1) {
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
               &module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    wabt::Module::Module((Module *)local_430);
    options._39_1_ = 1;
    log_stream = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::get
                           (&s_log_stream);
    wabt::ReadBinaryOptions::ReadBinaryOptions
              ((ReadBinaryOptions *)local_460,&s_features,&log_stream->super_Stream,
               (bool)(s_read_debug_names & 1),true,(bool)(s_fail_on_custom_section_error & 1));
    pcVar3 = (char *)std::__cxx11::string::c_str();
    data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    options_1.features._15_4_ =
         wabt::ReadBinaryIr(pcVar3,data,size,(ReadBinaryOptions *)local_460,
                            (Errors *)
                            &module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (Module *)local_430);
    file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (Result)options_1.features._15_4_;
    bVar1 = wabt::Succeeded((Result)options_1.features._15_4_);
    if (bVar1) {
      options_1.features.annotations_enabled_ =
           (bool)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._4_1_;
      options_1.features.code_metadata_enabled_ =
           (bool)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._5_1_;
      options_1.features.gc_enabled_ =
           (bool)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._6_1_;
      options_1.features.memory64_enabled_ =
           (bool)file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._7_1_;
      bVar1 = wabt::Succeeded(file_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      if ((bVar1) && ((s_validate & 1U) != 0)) {
        wabt::ValidateOptions::ValidateOptions((ValidateOptions *)local_47f,&s_features);
        file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             wabt::ValidateModule
                       ((Module *)local_430,
                        (Errors *)
                        &module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (ValidateOptions *)local_47f);
      }
      if ((s_generate_names & 1U) != 0) {
        file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             wabt::GenerateNames((Module *)local_430,None);
      }
      bVar1 = wabt::Succeeded(file_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      if (bVar1) {
        wabt::ApplyNames((Module *)local_430);
      }
      bVar1 = wabt::Succeeded(file_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      if (bVar1) {
        wabt::WriteWatOptions::WriteWatOptions((WriteWatOptions *)&stream.field_0x36,&s_features);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          local_4f8 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view
                                ((string *)&s_outfile_abi_cxx11_);
          wabt::FileStream::FileStream((FileStream *)local_4e8,local_4f8,(Stream *)0x0);
        }
        else {
          wabt::FileStream::FileStream((FileStream *)local_4e8,_stdout,(Stream *)0x0);
        }
        local_4fc = (Enum)wabt::WriteWat((Stream *)local_4e8,(Module *)local_430,
                                         (WriteWatOptions *)&stream.field_0x36);
        file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = (Result)local_4fc;
        wabt::FileStream::~FileStream((FileStream *)local_4e8);
      }
    }
    file = _stderr;
    std::__cxx11::string::string((string *)&local_520);
    wabt::FormatErrorsToFile
              ((Errors *)&module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count,
               Binary,(LexerSourceLineFinder *)0x0,file,&local_520,Never,0x50);
    std::__cxx11::string::~string((string *)&local_520);
    wabt::Module::~Module((Module *)local_430);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
               &module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  EVar2 = wabt::Result::operator_cast_to_Enum
                    ((Result *)
                     ((long)&file_data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return (uint)(EVar2 != Ok);
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  result = ReadFile(s_infile.c_str(), &file_data);
  if (Succeeded(result)) {
    Errors errors;
    Module module;
    const bool kStopOnFirstError = true;
    ReadBinaryOptions options(s_features, s_log_stream.get(),
                              s_read_debug_names, kStopOnFirstError,
                              s_fail_on_custom_section_error);
    result = ReadBinaryIr(s_infile.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module);
    if (Succeeded(result)) {
      if (Succeeded(result) && s_validate) {
        ValidateOptions options(s_features);
        result = ValidateModule(&module, &errors, options);
      }

      if (s_generate_names) {
        result = GenerateNames(&module);
      }

      if (Succeeded(result)) {
        /* TODO(binji): This shouldn't fail; if a name can't be applied
         * (because the index is invalid, say) it should just be skipped. */
        Result dummy_result = ApplyNames(&module);
        WABT_USE(dummy_result);
      }

      if (Succeeded(result)) {
        WriteWatOptions wat_options(s_features);
        wat_options.fold_exprs = s_fold_exprs;
        wat_options.inline_import = s_inline_import;
        wat_options.inline_export = s_inline_export;
        FileStream stream(!s_outfile.empty() ? FileStream(s_outfile)
                                             : FileStream(stdout));
        result = WriteWat(&stream, &module, wat_options);
      }
    }
    FormatErrorsToFile(errors, Location::Type::Binary);
  }
  return result != Result::Ok;
}